

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMDisassembler.c
# Opt level: O0

DecodeStatus DecodeT2AddrModeImm0_1020s4(MCInst *Inst,uint Val,uint64_t Address,void *Decoder)

{
  _Bool _Var1;
  uint32_t uVar2;
  uint32_t uVar3;
  DecodeStatus In;
  undefined8 in_RCX;
  MCInst *in_RDX;
  uint32_t in_ESI;
  MCInst *in_RDI;
  uint imm;
  uint Rn;
  DecodeStatus S;
  undefined4 in_stack_ffffffffffffffc8;
  uint RegNo;
  DecodeStatus local_4;
  
  RegNo = (uint)((ulong)in_RCX >> 0x20);
  local_4 = MCDisassembler_Success;
  uVar2 = fieldFromInstruction_4(in_ESI,8,4);
  uVar3 = fieldFromInstruction_4(in_ESI,0,8);
  In = DecodeGPRnopcRegisterClass
                 (in_RDX,RegNo,CONCAT44(local_4,uVar2),
                  (void *)CONCAT44(uVar3,in_stack_ffffffffffffffc8));
  _Var1 = Check((DecodeStatus *)&stack0xffffffffffffffd4,In);
  if (_Var1) {
    MCOperand_CreateImm0(in_RDI,(ulong)uVar3);
  }
  else {
    local_4 = MCDisassembler_Fail;
  }
  return local_4;
}

Assistant:

static DecodeStatus DecodeT2AddrModeImm0_1020s4(MCInst *Inst,unsigned Val,
		uint64_t Address, const void *Decoder)
{
	DecodeStatus S = MCDisassembler_Success;

	unsigned Rn = fieldFromInstruction_4(Val, 8, 4);
	unsigned imm = fieldFromInstruction_4(Val, 0, 8);

	if (!Check(&S, DecodeGPRnopcRegisterClass(Inst, Rn, Address, Decoder)))
		return MCDisassembler_Fail;

	MCOperand_CreateImm0(Inst, imm);

	return S;
}